

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.h
# Opt level: O2

void google::protobuf::compiler::java::
     MaybePrintGeneratedAnnotation<google::protobuf::EnumDescriptor_const>
               (Context *context,Printer *printer,EnumDescriptor *descriptor,bool immutable,
               string *suffix)

{
  bool bVar1;
  string *psVar2;
  string_view suffix_00;
  string_view annotation_file;
  allocator<char> local_99;
  string local_98;
  Options local_78;
  
  psVar2 = suffix;
  bVar1 = IsOwnFile<google::protobuf::EnumDescriptor>(descriptor,immutable);
  if (bVar1) {
    if ((context->options_).annotate_code == true) {
      suffix_00._M_str = (char *)psVar2;
      suffix_00._M_len = (size_t)(suffix->_M_dataplus)._M_p;
      AnnotationFileName<google::protobuf::EnumDescriptor>
                (&local_98,(java *)descriptor,(EnumDescriptor *)suffix->_M_string_length,suffix_00);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"",&local_99);
    }
    Options::Options(&local_78,&context->options_);
    annotation_file._M_str = local_98._M_dataplus._M_p;
    annotation_file._M_len = local_98._M_string_length;
    PrintGeneratedAnnotation(printer,'$',annotation_file,&local_78);
    Options::~Options(&local_78);
    std::__cxx11::string::~string((string *)&local_98);
  }
  return;
}

Assistant:

void MaybePrintGeneratedAnnotation(Context* context, io::Printer* printer,
                                   Descriptor* descriptor, bool immutable,
                                   const std::string& suffix = "") {
  if (IsOwnFile(descriptor, immutable)) {
    PrintGeneratedAnnotation(printer, '$',
                             context->options().annotate_code
                                 ? AnnotationFileName(descriptor, suffix)
                                 : "",
                             context->options());
  }
}